

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O2

bool __thiscall
duckdb_snappy::SnappyScatteredWriter<duckdb_snappy::SnappySinkAllocator>::AppendFromSelf
          (SnappyScatteredWriter<duckdb_snappy::SnappySinkAllocator> *this,size_t offset,size_t len,
          char **op_p)

{
  char *op;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  bool bVar8;
  ulong uVar9;
  char *pcVar10;
  char *op_limit;
  
  op = *op_p;
  uVar9 = (long)op - (long)this->op_base_;
  if (((offset < len) || (uVar9 < offset)) || (this->op_limit_min_slop_ <= op)) {
    if (offset == 0) {
      return false;
    }
    if (offset <= uVar9) {
      op_limit = op + len;
      if (op_limit <= this->op_limit_) {
        anon_unknown_3::IncrementalCopy(op + -offset,op,op_limit,this->op_limit_);
        bVar8 = true;
        goto LAB_00df6d42;
      }
    }
    this->op_ptr_ = op;
    bVar8 = SlowAppendFromSelf(this,offset,len);
    op_limit = this->op_ptr_;
  }
  else {
    op_limit = op + len;
    pcVar10 = op + -offset;
    uVar1 = *(undefined8 *)pcVar10;
    uVar2 = *(undefined8 *)(pcVar10 + 8);
    uVar3 = *(undefined8 *)(pcVar10 + 0x10);
    uVar4 = *(undefined8 *)(pcVar10 + 0x18);
    uVar5 = *(undefined8 *)(pcVar10 + 0x20);
    uVar6 = *(undefined8 *)(pcVar10 + 0x28);
    uVar7 = *(undefined8 *)(pcVar10 + 0x38);
    *(undefined8 *)(op + 0x30) = *(undefined8 *)(pcVar10 + 0x30);
    *(undefined8 *)(op + 0x38) = uVar7;
    *(undefined8 *)(op + 0x20) = uVar5;
    *(undefined8 *)(op + 0x28) = uVar6;
    *(undefined8 *)(op + 0x10) = uVar3;
    *(undefined8 *)(op + 0x18) = uVar4;
    *(undefined8 *)op = uVar1;
    *(undefined8 *)(op + 8) = uVar2;
    bVar8 = true;
  }
LAB_00df6d42:
  *op_p = op_limit;
  return bVar8;
}

Assistant:

inline bool AppendFromSelf(size_t offset, size_t len, char** op_p) {
    char* op = *op_p;
    assert(op >= op_base_);
    // Check if we try to append from before the start of the buffer.
    if (SNAPPY_PREDICT_FALSE((kSlopBytes < 64 && len > kSlopBytes) ||
                            static_cast<size_t>(op - op_base_) < offset ||
                            op >= op_limit_min_slop_ || offset < len)) {
      if (offset == 0) return false;
      if (SNAPPY_PREDICT_FALSE(static_cast<size_t>(op - op_base_) < offset ||
                              op + len > op_limit_)) {
        op_ptr_ = op;
        bool res = SlowAppendFromSelf(offset, len);
        *op_p = op_ptr_;
        return res;
      }
      *op_p = IncrementalCopy(op - offset, op, op + len, op_limit_);
      return true;
    }
    // Fast path
    char* const op_end = op + len;
    std::memmove(op, op - offset, kSlopBytes);
    *op_p = op_end;
    return true;
  }